

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  size_t *psVar1;
  long lVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  Arg *pAVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  char *__end;
  Arg *this_00;
  string usageCol;
  Text desc;
  Text usage;
  TextAttributes local_150;
  size_t local_130;
  Arg *local_128;
  size_t local_120;
  char *local_118;
  long local_110;
  char local_108 [16];
  size_t local_f8;
  Arg *local_f0;
  long local_e8;
  Text local_e0;
  Text local_88;
  
  pAVar6 = (this->m_options).
           super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_128 = (this->m_options).
              super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar6 != local_128) {
    uVar4 = 0;
    this_00 = pAVar6;
    local_130 = width;
    local_120 = indent;
    do {
      Arg::commands_abi_cxx11_(&local_88.str,this_00);
      sVar8 = local_88.str._M_string_length;
      if (local_88.str._M_string_length < uVar4) {
        sVar8 = uVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
        operator_delete(local_88.str._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
      uVar4 = sVar8;
    } while (this_00 != local_128);
    if (pAVar6 != local_128) {
      local_f8 = sVar8 + local_120;
      local_130 = (local_130 - sVar8) - 3;
      psVar1 = &local_150.width;
      local_e8 = local_120 + sVar8 + 2;
      do {
        Arg::commands_abi_cxx11_(&local_e0.str,pAVar6);
        local_150.initialIndent = 0xffffffffffffffff;
        local_150.tabChar = '\t';
        local_150.width = local_f8;
        local_150.indent = local_120;
        Catch::Text::Text(&local_88,&local_e0.str,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.str._M_dataplus._M_p != &local_e0.str.field_2) {
          operator_delete(local_e0.str._M_dataplus._M_p);
        }
        local_150.initialIndent = 0xffffffffffffffff;
        local_150.indent = 0;
        local_150.tabChar = '\t';
        local_150.width = local_130;
        local_f0 = pAVar6;
        Catch::Text::Text(&local_e0,&pAVar6->description,&local_150);
        if (0x1f < (ulong)((long)local_e0.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_e0.lines.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start |
                          (long)local_88.lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88.lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          uVar4 = (long)local_88.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.lines.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar9 = 8;
          uVar7 = 0;
          do {
            local_150.initialIndent = (size_t)psVar1;
            if (uVar7 < uVar4) {
              lVar2 = *(long *)((long)local_88.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_150,lVar2,
                         *(long *)((long)&((local_88.lines.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar9) + lVar2);
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"","");
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,(char *)local_150.initialIndent,local_150.indent);
            if ((uVar7 < (ulong)((long)local_e0.lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_e0.lines.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
               (*(long *)((long)&((local_e0.lines.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar9) != 0)) {
              local_118 = local_108;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_118,(char)local_e8 - (char)local_150.indent);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,local_118,local_110);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,*(char **)((long)local_e0.lines.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                          lVar9 + -8),
                         *(long *)((long)&((local_e0.lines.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar9));
              if (local_118 != local_108) {
                operator_delete(local_118);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            if ((size_t *)local_150.initialIndent != psVar1) {
              operator_delete((void *)local_150.initialIndent);
            }
            uVar7 = uVar7 + 1;
            uVar4 = (long)local_88.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            uVar5 = (long)local_e0.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e0.lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (uVar5 < uVar4) {
              uVar5 = uVar4;
            }
            lVar9 = lVar9 + 0x20;
          } while (uVar7 < uVar5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0.lines);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.str._M_dataplus._M_p != &local_e0.str.field_2) {
          operator_delete(local_e0.str._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88.lines);
        pAVar6 = local_f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.str._M_dataplus._M_p != &local_88.str.field_2) {
          operator_delete(local_88.str._M_dataplus._M_p);
        }
        pAVar6 = pAVar6 + 1;
      } while (pAVar6 != local_128);
    }
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = CATCH_CONFIG_CONSOLE_WIDTH ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Catch::Text usage( it->commands(), Catch::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                // !TBD handle longer usage strings
                Catch::Text desc( it->description, Catch::TextAttributes()
                                                        .setWidth( width - maxWidth -3 ) );

                for( std::size_t i = 0; i < (std::max)( usage.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usage.size() ? usage[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }